

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode Curl_resolver_is_resolved(Curl_easy *data,Curl_dns_entry **entry)

{
  int iVar1;
  thread_data *ptVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLcode CVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  long local_38;
  timediff_t elapsed;
  CURLcode result;
  int done;
  thread_data *td;
  Curl_dns_entry **entry_local;
  Curl_easy *data_local;
  
  ptVar2 = (data->state).async.tdata;
  *entry = (Curl_dns_entry *)0x0;
  if (ptVar2 == (thread_data *)0x0) {
    data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)(ptVar2->tsd).mtx);
    iVar1 = (ptVar2->tsd).done;
    pthread_mutex_unlock((pthread_mutex_t *)(ptVar2->tsd).mtx);
    if (iVar1 == 0) {
      cVar6 = Curl_now();
      uVar3 = (data->progress).t_startsingle.tv_sec;
      uVar4 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar4;
      older.tv_sec = uVar3;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar6._0_12_,0);
      newer.tv_usec = SUB124(cVar6._0_12_,8);
      older._12_4_ = 0;
      local_38 = Curl_timediff(newer,older);
      if (local_38 < 0) {
        local_38 = 0;
      }
      if (ptVar2->poll_interval == 0) {
        ptVar2->poll_interval = 1;
      }
      else if (ptVar2->interval_end <= local_38) {
        ptVar2->poll_interval = ptVar2->poll_interval << 1;
      }
      if (0xfa < ptVar2->poll_interval) {
        ptVar2->poll_interval = 0xfa;
      }
      ptVar2->interval_end = local_38 + (ulong)ptVar2->poll_interval;
      Curl_expire(data,(ulong)ptVar2->poll_interval,EXPIRE_ASYNC_NAME);
    }
    else {
      getaddrinfo_complete(data);
      if ((data->state).async.dns == (Curl_dns_entry *)0x0) {
        CVar5 = Curl_resolver_error(data);
        destroy_async_data(&(data->state).async);
        return CVar5;
      }
      destroy_async_data(&(data->state).async);
      *entry = (data->state).async.dns;
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct Curl_easy *data,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data *td = data->state.async.tdata;
  int done = 0;

  DEBUGASSERT(entry);
  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(data);

    if(!data->state.async.dns) {
      CURLcode result = Curl_resolver_error(data);
      destroy_async_data(&data->state.async);
      return result;
    }
    destroy_async_data(&data->state.async);
    *entry = data->state.async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    /* should be fine even if this converts to 32-bit */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}